

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O1

monst * newmonst(int extyp,int namelen)

{
  monst *__s;
  uint uVar1;
  size_t __size;
  
  uVar1 = 0;
  if (extyp - 1U < 5) {
    uVar1 = *(uint *)(&DAT_002b16f4 + (ulong)(extyp - 1U) * 4);
  }
  __size = (long)namelen + (ulong)uVar1 + 0x78;
  __s = (monst *)malloc(__size);
  memset(__s,0,__size);
  __s->mxtyp = (uchar)extyp;
  __s->mxlth = (short)uVar1;
  __s->mnamelth = (uchar)namelen;
  return __s;
}

Assistant:

struct monst *newmonst(int extyp, int namelen)
{
	struct monst *mon;
	int xlen;
	
	switch (extyp) {
	    case MX_EMIN: xlen = sizeof(struct emin); break;
	    case MX_EPRI: xlen = sizeof(struct epri); break;
	    case MX_EGD:  xlen = sizeof(struct egd);  break;
	    case MX_ESHK: xlen = sizeof(struct eshk); break;
	    case MX_EDOG: xlen = sizeof(struct edog); break;
	    default:      xlen = 0; break;
	}
	
	mon = malloc(sizeof(struct monst) + namelen + xlen);
	memset(mon, 0, sizeof(struct monst) + namelen + xlen);
	mon->mxtyp = extyp;
	mon->mxlth = xlen;
	mon->mnamelth = namelen;
	
	return mon;
}